

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

int parse_args_DEF(Context *ctx)

{
  Context *ctx_local;
  
  parse_destination_token(ctx,&ctx->dest_arg);
  if ((ctx->dest_arg).regtype != REG_TYPE_CONST) {
    fail(ctx,"DEF using non-CONST register");
  }
  if ((ctx->dest_arg).relative != 0) {
    fail(ctx,"relative addressing in DEF");
  }
  ctx->dwords[0] = *ctx->tokens;
  ctx->dwords[1] = ctx->tokens[1];
  ctx->dwords[2] = ctx->tokens[2];
  ctx->dwords[3] = ctx->tokens[3];
  return 6;
}

Assistant:

static int parse_args_DEF(Context *ctx)
{
    parse_destination_token(ctx, &ctx->dest_arg);
    if (ctx->dest_arg.regtype != REG_TYPE_CONST)
        fail(ctx, "DEF using non-CONST register");
    if (ctx->dest_arg.relative)  // I'm pretty sure this is illegal...?
        fail(ctx, "relative addressing in DEF");

    ctx->dwords[0] = SWAP32(ctx->tokens[0]);
    ctx->dwords[1] = SWAP32(ctx->tokens[1]);
    ctx->dwords[2] = SWAP32(ctx->tokens[2]);
    ctx->dwords[3] = SWAP32(ctx->tokens[3]);

    return 6;
}